

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalRangeJoin::PhysicalRangeJoin
          (PhysicalRangeJoin *this,LogicalComparisonJoin *op,PhysicalOperatorType type,
          PhysicalOperator *left,PhysicalOperator *right,vector<duckdb::JoinCondition,_true> *cond,
          JoinType join_type,idx_t estimated_cardinality)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  pointer *pprVar1;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var2;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  pointer pLVar6;
  pointer pLVar7;
  iterator iVar8;
  pointer pJVar9;
  pointer pJVar10;
  pointer pJVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  size_type __n;
  iterator iVar15;
  size_type __n_00;
  size_type __n_01;
  size_type __n_02;
  PhysicalOperator *pPVar16;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_e8;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_c8;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_c0;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_a0;
  LogicalComparisonJoin *local_98;
  vector<duckdb::JoinCondition,_true> *local_90;
  PhysicalOperator *local_88;
  PhysicalOperator *local_80;
  pointer local_78;
  pointer pJStack_70;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_68;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_48;
  
  local_68.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = op;
  local_80 = right;
  PhysicalComparisonJoin::PhysicalComparisonJoin
            (&this->super_PhysicalComparisonJoin,(LogicalOperator *)op,type,
             (vector<duckdb::JoinCondition,_true> *)&local_68,join_type,estimated_cardinality);
  local_88 = left;
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_68);
  (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
  super_PhysicalOperator._vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalRangeJoin_0245b648;
  local_c0 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->left_projection_map;
  local_c8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->right_projection_map;
  local_a0 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->unprojected_types;
  (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->unprojected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unprojected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unprojected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)(this->super_PhysicalComparisonJoin).conditions.
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->super_PhysicalComparisonJoin).conditions.
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (1 < __n) {
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::vector
              (&local_b8,__n,(allocator_type *)&local_e8);
    pJVar11 = local_b8.
              super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_90 = &(this->super_PhysicalComparisonJoin).conditions;
    pJVar9 = (this->super_PhysicalComparisonJoin).conditions.
             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pJVar10 = (this->super_PhysicalComparisonJoin).conditions.
              super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->super_PhysicalComparisonJoin).conditions.
         super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
         super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_PhysicalComparisonJoin).conditions.
    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_90->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_PhysicalComparisonJoin).conditions.
    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78 = local_b8.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pJStack_70 = local_b8.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_start = pJVar9;
    local_b8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_finish = pJVar10;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_e8)
    ;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->super_PhysicalComparisonJoin).conditions.
         super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
         super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->super_PhysicalComparisonJoin).conditions.
    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pJVar11;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->super_PhysicalComparisonJoin).conditions.
         super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
         super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->super_PhysicalComparisonJoin).conditions.
         super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
         super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->super_PhysicalComparisonJoin).conditions.
    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
    super__Vector_impl_data._M_start = local_78;
    (this->super_PhysicalComparisonJoin).conditions.
    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
    super__Vector_impl_data._M_finish = pJStack_70;
    local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_e8)
    ;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_48)
    ;
    if ((long)local_b8.
              super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.
              super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      __n_02 = ((long)local_b8.
                      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      __n_00 = 0;
      __n_01 = 0;
      do {
        pvVar12 = vector<duckdb::JoinCondition,_true>::operator[]
                            ((vector<duckdb::JoinCondition,_true> *)&local_b8,__n_01);
        if ((byte)(pvVar12->comparison - COMPARE_LESSTHAN) < 4) {
          pvVar12 = vector<duckdb::JoinCondition,_true>::operator[]
                              ((vector<duckdb::JoinCondition,_true> *)&local_b8,__n_01);
          pvVar13 = vector<duckdb::JoinCondition,_true>::operator[](local_90,__n_00);
          _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (pvVar12->left).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>;
          (pvVar12->left).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          _Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (pvVar13->left).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>;
          (pvVar13->left).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          if (_Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
              (Expression *)0x0) {
            (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                  _M_head_impl + 8))();
          }
          __n_00 = __n_00 + 1;
        }
        else {
          pvVar12 = vector<duckdb::JoinCondition,_true>::operator[]
                              ((vector<duckdb::JoinCondition,_true> *)&local_b8,__n_01);
          __n_02 = __n_02 - 1;
          pvVar13 = vector<duckdb::JoinCondition,_true>::operator[](local_90,__n_02);
          _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (pvVar12->left).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>;
          (pvVar12->left).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          _Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (pvVar13->left).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>;
          (pvVar13->left).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          if (_Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
              (Expression *)0x0) {
            (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                  _M_head_impl + 8))();
          }
        }
        _Var4._M_head_impl =
             (pvVar12->right).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar12->right).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        _Var5._M_head_impl =
             (pvVar13->right).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar13->right).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
        if (_Var5._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
        }
        pvVar13->comparison = pvVar12->comparison;
        __n_01 = __n_01 + 1;
      } while (__n_01 < (ulong)(((long)local_b8.
                                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_b8)
    ;
  }
  this_00 = &(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
             super_PhysicalOperator.children;
  local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_88;
  iVar15._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                super_CachingPhysicalOperator.super_PhysicalOperator.children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        + 8);
  if (iVar15._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator
               .super_PhysicalOperator.children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       + 0x10)) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)this_00,iVar15,(reference_wrapper<duckdb::PhysicalOperator> *)&local_e8);
    iVar15._M_current =
         *(pointer *)
          ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                  super_CachingPhysicalOperator.super_PhysicalOperator.children.
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          + 8);
  }
  else {
    (iVar15._M_current)->_M_data = local_88;
    iVar15._M_current =
         *(pointer *)
          ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                  super_CachingPhysicalOperator.super_PhysicalOperator.children.
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          + 8) + 1;
    *(reference_wrapper<duckdb::PhysicalOperator> **)
     ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
             super_PhysicalOperator.children.
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
     + 8) = iVar15._M_current;
  }
  local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_80;
  if (iVar15._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator
               .super_PhysicalOperator.children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       + 0x10)) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)this_00,iVar15,(reference_wrapper<duckdb::PhysicalOperator> *)&local_e8);
  }
  else {
    (iVar15._M_current)->_M_data = local_80;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                      super_CachingPhysicalOperator.super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
             &(local_98->super_LogicalJoin).left_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  if ((this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
    pLVar6 = (pvVar14->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar7 = (pvVar14->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar16 = (PhysicalOperator *)(((long)pLVar7 - (long)pLVar6 >> 3) * -0x5555555555555555);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,(size_type)pPVar16)
    ;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (pLVar7 != pLVar6) {
      do {
        iVar8._M_current =
             (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
             .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>(local_c0,iVar8,(unsigned_long *)&local_e8);
        }
        else {
          *iVar8._M_current =
               (unsigned_long)
               local_e8.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&(local_e8.
                               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               ._M_impl.super__Vector_impl_data._M_start)->left + 1);
      } while (local_e8.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start < pPVar16);
    }
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
             &(local_98->super_LogicalJoin).right_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  if ((this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,1);
    pLVar6 = (pvVar14->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar7 = (pvVar14->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar16 = (PhysicalOperator *)(((long)pLVar7 - (long)pLVar6 >> 3) * -0x5555555555555555);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,(size_type)pPVar16)
    ;
    local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (pLVar7 != pLVar6) {
      do {
        iVar8._M_current =
             (this->right_projection_map).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
            .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>(local_c8,iVar8,(unsigned_long *)&local_e8);
        }
        else {
          *iVar8._M_current =
               (unsigned_long)
               local_e8.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        local_e8.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&(local_e8.
                               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               ._M_impl.super__Vector_impl_data._M_start)->left + 1);
      } while (local_e8.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start < pPVar16);
    }
  }
  pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (local_a0,&(pvVar14->_M_data->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,1);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)local_a0,
             (this->unprojected_types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (pvVar14->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (pvVar14->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

PhysicalRangeJoin::PhysicalRangeJoin(LogicalComparisonJoin &op, PhysicalOperatorType type, PhysicalOperator &left,
                                     PhysicalOperator &right, vector<JoinCondition> cond, JoinType join_type,
                                     idx_t estimated_cardinality)
    : PhysicalComparisonJoin(op, type, std::move(cond), join_type, estimated_cardinality) {
	// Reorder the conditions so that ranges are at the front.
	// TODO: use stats to improve the choice?
	// TODO: Prefer fixed length types?
	if (conditions.size() > 1) {
		vector<JoinCondition> conditions_p(conditions.size());
		std::swap(conditions_p, conditions);
		idx_t range_position = 0;
		idx_t other_position = conditions_p.size();
		for (idx_t i = 0; i < conditions_p.size(); ++i) {
			switch (conditions_p[i].comparison) {
			case ExpressionType::COMPARE_LESSTHAN:
			case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			case ExpressionType::COMPARE_GREATERTHAN:
			case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
				conditions[range_position++] = std::move(conditions_p[i]);
				break;
			default:
				conditions[--other_position] = std::move(conditions_p[i]);
				break;
			}
		}
	}

	children.push_back(left);
	children.push_back(right);

	//	Fill out the left projection map.
	left_projection_map = op.left_projection_map;
	if (left_projection_map.empty()) {
		const auto left_count = children[0].get().GetTypes().size();
		left_projection_map.reserve(left_count);
		for (column_t i = 0; i < left_count; ++i) {
			left_projection_map.emplace_back(i);
		}
	}
	//	Fill out the right projection map.
	right_projection_map = op.right_projection_map;
	if (right_projection_map.empty()) {
		const auto right_count = children[1].get().GetTypes().size();
		right_projection_map.reserve(right_count);
		for (column_t i = 0; i < right_count; ++i) {
			right_projection_map.emplace_back(i);
		}
	}

	//	Construct the unprojected type layout from the children's types
	unprojected_types = children[0].get().GetTypes();
	auto &types = children[1].get().GetTypes();
	unprojected_types.insert(unprojected_types.end(), types.begin(), types.end());
}